

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O1

void getnameinfo_req(uv_getnameinfo_t *handle,int status,char *hostname,char *service)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  char *pcVar3;
  undefined8 in_R9;
  
  if (handle == (uv_getnameinfo_t *)0x0) {
    getnameinfo_req_cold_4();
LAB_0015bc0b:
    getnameinfo_req_cold_1();
LAB_0015bc10:
    getnameinfo_req_cold_3();
  }
  else {
    if (status != 0) goto LAB_0015bc0b;
    if (hostname == (char *)0x0) goto LAB_0015bc10;
    if (service != (char *)0x0) {
      return;
    }
  }
  getnameinfo_req_cold_2();
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(uVar2,&req,0,&addr4,0);
    if (iVar1 != 0) goto LAB_0015bcaa;
    if (req.host[0] == '\0') goto LAB_0015bcaf;
    if (req.service[0] == '\0') goto LAB_0015bcb4;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_sync_cold_1();
LAB_0015bcaa:
    run_test_getnameinfo_basic_ip4_sync_cold_2();
LAB_0015bcaf:
    run_test_getnameinfo_basic_ip4_sync_cold_5();
LAB_0015bcb4:
    run_test_getnameinfo_basic_ip4_sync_cold_4();
  }
  run_test_getnameinfo_basic_ip4_sync_cold_3();
  pcVar3 = "::1";
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  if (iVar1 == 0) {
    pcVar3 = (char *)uv_default_loop();
    iVar1 = uv_getnameinfo(pcVar3,&req,getnameinfo_req,&addr6,0,in_R9,unaff_RBX);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar3);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0015bd55;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_0015bd55:
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(pcVar3,0);
  return;
}

Assistant:

static void getnameinfo_req(uv_getnameinfo_t* handle,
                            int status,
                            const char* hostname,
                            const char* service) {
  ASSERT(handle != NULL);
  ASSERT(status == 0);
  ASSERT(hostname != NULL);
  ASSERT(service != NULL);
}